

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O3

void aom_highbd_dc_predictor_16x8_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  uint16_t *puVar1;
  bool bVar2;
  bool bVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  auVar5._0_2_ = left[4] + *left;
  auVar5._2_2_ = left[5] + left[1];
  auVar5._4_2_ = left[6] + left[2];
  auVar5._6_2_ = left[7] + left[3];
  auVar5._8_2_ = left[4];
  auVar5._10_2_ = left[5];
  auVar5._12_2_ = left[6];
  auVar5._14_2_ = left[7];
  auVar7 = pshuflw(in_XMM2,auVar5,0xe);
  auVar6 = *(undefined1 (*) [16])above;
  auVar8 = *(undefined1 (*) [16])(above + 8);
  auVar9._0_2_ = auVar6._8_2_ + auVar6._0_2_;
  auVar9._2_2_ = auVar6._10_2_ + auVar6._2_2_;
  auVar9._4_2_ = auVar6._12_2_ + auVar6._4_2_;
  auVar9._6_2_ = auVar6._14_2_ + auVar6._6_2_;
  auVar9._8_2_ = auVar6._8_2_;
  auVar9._10_2_ = auVar6._10_2_;
  auVar9._12_2_ = auVar6._12_2_;
  auVar9._14_2_ = auVar6._14_2_;
  auVar6 = pshuflw(auVar6,auVar9,0xe);
  auVar10._0_2_ = auVar8._8_2_ + auVar8._0_2_;
  auVar10._2_2_ = auVar8._10_2_ + auVar8._2_2_;
  auVar10._4_2_ = auVar8._12_2_ + auVar8._4_2_;
  auVar10._6_2_ = auVar8._14_2_ + auVar8._6_2_;
  auVar10._8_2_ = auVar8._8_2_;
  auVar10._10_2_ = auVar8._10_2_;
  auVar10._12_2_ = auVar8._12_2_;
  auVar10._14_2_ = auVar8._14_2_;
  auVar8 = pshuflw(auVar8,auVar10,0xe);
  auVar6 = ZEXT416(((uint)(ushort)(auVar6._0_2_ + auVar9._0_2_ + auVar8._0_2_ + auVar10._0_2_ +
                                   auVar6._2_2_ + auVar9._2_2_ + auVar8._2_2_ + auVar10._2_2_) +
                    (uint)(ushort)(auVar7._2_2_ + auVar5._2_2_ + auVar7._0_2_ + auVar5._0_2_) + 0xc)
                   / 0x18);
  auVar6 = pshuflw(auVar6,auVar6,0);
  uVar4 = auVar6._0_4_;
  bVar2 = true;
  do {
    bVar3 = bVar2;
    *(undefined4 *)dst = uVar4;
    *(undefined4 *)(dst + 2) = uVar4;
    *(undefined4 *)(dst + 4) = uVar4;
    *(undefined4 *)(dst + 6) = uVar4;
    *(undefined4 *)(dst + 8) = uVar4;
    *(undefined4 *)(dst + 10) = uVar4;
    *(undefined4 *)(dst + 0xc) = uVar4;
    *(undefined4 *)(dst + 0xe) = uVar4;
    puVar1 = dst + stride;
    *(undefined4 *)puVar1 = uVar4;
    *(undefined4 *)(puVar1 + 2) = uVar4;
    *(undefined4 *)(puVar1 + 4) = uVar4;
    *(undefined4 *)(puVar1 + 6) = uVar4;
    puVar1 = dst + stride + 8;
    *(undefined4 *)puVar1 = uVar4;
    *(undefined4 *)(puVar1 + 2) = uVar4;
    *(undefined4 *)(puVar1 + 4) = uVar4;
    *(undefined4 *)(puVar1 + 6) = uVar4;
    puVar1 = dst + stride * 2;
    *(undefined4 *)puVar1 = uVar4;
    *(undefined4 *)(puVar1 + 2) = uVar4;
    *(undefined4 *)(puVar1 + 4) = uVar4;
    *(undefined4 *)(puVar1 + 6) = uVar4;
    puVar1 = dst + stride * 2 + 8;
    *(undefined4 *)puVar1 = uVar4;
    *(undefined4 *)(puVar1 + 2) = uVar4;
    *(undefined4 *)(puVar1 + 4) = uVar4;
    *(undefined4 *)(puVar1 + 6) = uVar4;
    puVar1 = dst + stride * 3;
    *(undefined4 *)puVar1 = uVar4;
    *(undefined4 *)(puVar1 + 2) = uVar4;
    *(undefined4 *)(puVar1 + 4) = uVar4;
    *(undefined4 *)(puVar1 + 6) = uVar4;
    puVar1 = dst + stride * 3 + 8;
    *(undefined4 *)puVar1 = uVar4;
    *(undefined4 *)(puVar1 + 2) = uVar4;
    *(undefined4 *)(puVar1 + 4) = uVar4;
    *(undefined4 *)(puVar1 + 6) = uVar4;
    dst = dst + stride * 4;
    bVar2 = false;
  } while (bVar3);
  return;
}

Assistant:

void aom_highbd_dc_predictor_16x8_sse2(uint16_t *dst, ptrdiff_t stride,
                                       const uint16_t *above,
                                       const uint16_t *left, int bd) {
  (void)bd;
  __m128i sum_left = dc_sum_8(left);
  __m128i sum_above = dc_sum_16(above);
  const __m128i zero = _mm_setzero_si128();
  sum_left = _mm_unpacklo_epi16(sum_left, zero);
  sum_above = _mm_unpacklo_epi16(sum_above, zero);
  const __m128i sum = _mm_add_epi32(sum_left, sum_above);
  uint32_t sum32 = (uint32_t)_mm_cvtsi128_si32(sum);
  sum32 += 12;
  sum32 /= 24;
  const __m128i row = _mm_set1_epi16((int16_t)sum32);
  int i;
  for (i = 0; i < 2; ++i) {
    _mm_store_si128((__m128i *)dst, row);
    _mm_store_si128((__m128i *)(dst + 8), row);
    dst += stride;
    _mm_store_si128((__m128i *)dst, row);
    _mm_store_si128((__m128i *)(dst + 8), row);
    dst += stride;
    _mm_store_si128((__m128i *)dst, row);
    _mm_store_si128((__m128i *)(dst + 8), row);
    dst += stride;
    _mm_store_si128((__m128i *)dst, row);
    _mm_store_si128((__m128i *)(dst + 8), row);
    dst += stride;
  }
}